

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetInt32
          (OptionInterpreter *this,int number,int32 value,Type type,UnknownFieldSet *unknown_fields)

{
  uint32 uVar1;
  LogMessage *pLVar2;
  LogFinisher local_6d [13];
  LogMessage local_60;
  UnknownFieldSet *local_28;
  UnknownFieldSet *unknown_fields_local;
  int32 local_18;
  Type type_local;
  int32 value_local;
  int number_local;
  OptionInterpreter *this_local;
  
  local_28 = unknown_fields;
  unknown_fields_local._4_4_ = type;
  local_18 = value;
  type_local = number;
  _value_local = this;
  if (type == TYPE_INT32) {
    UnknownFieldSet::AddVarint(unknown_fields,number,(long)value);
  }
  else if (type == TYPE_SFIXED32) {
    UnknownFieldSet::AddFixed32(unknown_fields,number,value);
  }
  else if (type == TYPE_SINT32) {
    uVar1 = internal::WireFormatLite::ZigZagEncode32(value);
    UnknownFieldSet::AddVarint(unknown_fields,number,(ulong)uVar1);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x1317);
    pLVar2 = internal::LogMessage::operator<<(&local_60,"Invalid wire type for CPPTYPE_INT32: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,unknown_fields_local._4_4_);
    internal::LogFinisher::operator=(local_6d,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetInt32(int number, int32 value,
    FieldDescriptor::Type type, UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_INT32:
      unknown_fields->AddVarint(number,
        static_cast<uint64>(static_cast<int64>(value)));
      break;

    case FieldDescriptor::TYPE_SFIXED32:
      unknown_fields->AddFixed32(number, static_cast<uint32>(value));
      break;

    case FieldDescriptor::TYPE_SINT32:
      unknown_fields->AddVarint(number,
          google::protobuf::internal::WireFormatLite::ZigZagEncode32(value));
      break;

    default:
      GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_INT32: " << type;
      break;
  }
}